

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool anon_unknown.dwarf_ea234d::Op_JitEq
               (bool *result,Value *src1Val,Value *src2Val,Var src1Var,Var src2Var,Func *func,
               bool isStrict)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (src1Val == (Value *)0x0 || src2Val == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1a42,"(src1Val != nullptr && src2Val != nullptr)",
                       "src1Val != nullptr && src2Val != nullptr");
    if (!bVar2) goto LAB_00462bae;
    *puVar4 = 0;
  }
  if (src1Var != src2Var) {
    bVar2 = TryCompIntAndFloat(result,src1Var,src2Var);
    if (!bVar2) {
      bVar2 = TryCompIntAndFloat(result,src2Var,src1Var);
      return bVar2;
    }
    return true;
  }
  if (((ulong)src1Var & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)src1Var & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00462bae:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((((ulong)src1Var & 0xffff000000000000) != 0x1000000000000) &&
     ((isStrict || (bVar2 = ValueType::IsNotFloat(&src1Val->valueInfo->super_ValueType), !bVar2))))
  {
    if ((ulong)src1Var >> 0x32 != 0) {
      bVar2 = Js::NumberUtilities::IsNan((double)((ulong)src1Var ^ 0xfffc000000000000));
      *result = !bVar2;
      return true;
    }
    iVar3 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
    if (((((Var)CONCAT44(extraout_var,iVar3) != src1Var) &&
         (iVar3 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])(),
         (Var)CONCAT44(extraout_var_00,iVar3) != src1Var)) &&
        (iVar3 = (**func->m_scriptContextInfo->_vptr_ScriptContextInfo)(),
        (Var)CONCAT44(extraout_var_01,iVar3) != src1Var)) &&
       (iVar3 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[1])(),
       (Var)CONCAT44(extraout_var_02,iVar3) != src1Var)) {
      return false;
    }
  }
  *result = true;
  return true;
}

Assistant:

bool Op_JitEq(bool * result, Value * src1Val, Value * src2Val, Js::Var src1Var, Js::Var src2Var, Func * func, bool isStrict)
    {
        Assert(src1Val != nullptr && src2Val != nullptr);
        Assert(src1Var != nullptr && src2Var != nullptr);

        if (src1Var == src2Var)
        {
            if (Js::TaggedInt::Is(src1Var))
            {
                *result = true;
                return true;
            }

            if (!isStrict && src1Val->GetValueInfo()->IsNotFloat())
            {
                // If the vars are equal and they are not NaN, non-strict equal returns true. Not float guarantees not NaN.
                *result = true;
                return true;
            }

#if FLOATVAR
            if (Js::JavascriptNumber::Is_NoTaggedIntCheck(src1Var))
            {
                *result = !Js::JavascriptNumber::IsNan(Js::JavascriptNumber::GetValue(src1Var));
                return true;
            }
#endif

            if (src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetTrueAddr()) ||
                src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetFalseAddr()) ||
                src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetNullAddr()) ||
                src1Var == reinterpret_cast<Js::Var>(func->GetScriptContextInfo()->GetUndefinedAddr()))
            {
                *result = true;
                return true;
            }

            // Other var comparisons require the runtime to prove.
            return false;
        }

#if FLOATVAR
        if (TryCompIntAndFloat(result, src1Var, src2Var) || TryCompIntAndFloat(result, src2Var, src1Var))
        {
            return true;
        }

#endif

        return false;
    }